

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmSourceFileSetProperty(void *arg,char *prop,char *value)

{
  cmSourceFile *this;
  char *value_00;
  allocator<char> local_39;
  string local_38;
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    if (prop == (char *)0x0) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,prop,&local_39);
    value_00 = "NOTFOUND";
    if (value != (char *)0x0) {
      value_00 = value;
    }
    cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_38,value_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,prop,&local_39);
    cmSourceFile::SetProperty(this,&local_38,value);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void CCONV cmSourceFileSetProperty(void* arg, const char* prop,
                                          const char* value)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    rsf->SetProperty(prop, value);
  } else if (prop) {
    if (!value) {
      value = "NOTFOUND";
    }
    sf->Properties.SetProperty(prop, value);
  }
}